

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,LambdaNode *node)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  BlockNode *pBVar4;
  LambdaNode *in_RSI;
  long in_RDI;
  PrintVisitor visitor;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *__range1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_stack_fffffffffffffe78;
  unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe80;
  ostream *in_stack_fffffffffffffe88;
  PrintVisitor *in_stack_fffffffffffffe90;
  PrintVisitor *in_stack_fffffffffffffea8;
  string local_d8 [32];
  undefined1 local_b8 [24];
  string local_a0 [32];
  reference local_80;
  _Self local_78;
  _Self local_70;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *local_68;
  string local_60 [48];
  string local_30 [32];
  LambdaNode *local_10;
  
  poVar2 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_fffffffffffffea8);
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,"LambdaNode (");
  LambdaNode::getReturnType(local_10);
  pmVar3 = std::
           unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar2,"):\n");
  std::__cxx11::string::~string(local_30);
  poVar2 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_fffffffffffffea8);
  poVar2 = std::operator<<(poVar2,local_60);
  std::operator<<(poVar2,"Arguments:\n");
  std::__cxx11::string::~string(local_60);
  local_68 = LambdaNode::getArguments_abi_cxx11_(local_10);
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::begin(in_stack_fffffffffffffe78);
  local_78._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::end(in_stack_fffffffffffffe78);
  while( true ) {
    bVar1 = std::operator!=(&local_70,&local_78);
    if (!bVar1) break;
    local_80 = std::
               _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
               ::operator*((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                            *)in_stack_fffffffffffffe80);
    poVar2 = *(ostream **)(in_RDI + 8);
    indent_abi_cxx11_(in_stack_fffffffffffffea8);
    poVar2 = std::operator<<(poVar2,local_a0);
    poVar2 = std::operator<<(poVar2," ");
    in_stack_fffffffffffffea8 = (PrintVisitor *)std::operator<<(poVar2,(string *)local_80);
    poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffea8," (");
    pmVar3 = std::
             unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe90 = (PrintVisitor *)std::operator<<(poVar2,(string *)pmVar3);
    std::operator<<((ostream *)in_stack_fffffffffffffe90,")\n");
    std::__cxx11::string::~string(local_a0);
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
    ::operator++(&local_70);
  }
  PrintVisitor(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  poVar2 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_fffffffffffffea8);
  poVar2 = std::operator<<(poVar2,local_d8);
  std::operator<<(poVar2,"Body:\n");
  std::__cxx11::string::~string(local_d8);
  pBVar4 = LambdaNode::getBody((LambdaNode *)0x13926a);
  (*(pBVar4->super_StatementNode).super_Node._vptr_Node[2])(pBVar4,local_b8);
  ~PrintVisitor((PrintVisitor *)0x139294);
  return;
}

Assistant:

void PrintVisitor::visit(const LambdaNode& node)
{
  stream_ << indent() << "LambdaNode (" 
    << TypeNameStrings.at(node.getReturnType()) << "):\n";
  stream_ << indent() << "Arguments:\n";
  for(const auto& arg : node.getArguments())
  {
    stream_ << indent() << " " << arg.first 
      << " (" << TypeNameStrings.at(arg.second) << ")\n";
  }
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Body:\n";
  node.getBody().accept(visitor);
}